

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O1

void __thiscall
CTestResource_TestCompressedSurface_Test::TestBody(CTestResource_TestCompressedSurface_Test *this)

{
  GMM_RESOURCE_INFO *ResourceInfo;
  ulong uVar1;
  uint uVar2;
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_48 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uStack_90 = 0;
  uStack_40 = 0x100000000;
  local_78 = 0x100;
  uStack_70 = 0x100000100;
  local_98 = 0x1000000000;
  if (((uint)(CommonULT::pGfxAdapterInfo->SkuTable).field_0 & 0x40) == 0) {
    local_98 = 0x80000000000;
  }
  auVar3 = pmovsxbd(in_XMM1,0x4000400);
  uStack_a0 = auVar3._0_8_;
  local_a8 = 0x2400000002;
  ResourceInfo = (GMM_RESOURCE_INFO *)
                 (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                           (CommonULT::pGmmULTClientContext,&local_a8);
  uVar1 = (local_78 & 0xfffffffffffffffc) * 2 + 0x7f & 0xffffffffffffff80;
  uVar2 = (uint)uStack_70 >> 2;
  CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,(uint32_t)uVar1);
  CTestResource::VerifyResourceSize<true>
            (&this->super_CTestResource,ResourceInfo,(uVar2 + 0x1f & 0xffffffe0) * uVar1);
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,ResourceInfo);
  return;
}

Assistant:

TEST_F(CTestResource, TestCompressedSurface)
{
    uint32_t TileSize[]  = {128, 32};
    uint32_t CompBlock[] = {4, 4};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.BaseWidth64          = 0x100;
    gmmParams.BaseHeight           = 0x100;
    gmmParams.Depth                = 0x1;
    SetTileFlag(gmmParams, TEST_TILEY);
    //TODO: Programatically test all compression formats.
    gmmParams.Format = GMM_FORMAT_BC1_UNORM; // BC1 is 4x4 compression block, 64bpe

    GMM_RESOURCE_INFO *ResourceInfo;
    ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

    uint64_t Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64 / CompBlock[0] * GetBppValue(TEST_BPP_64), TileSize[0]);
    uint64_t Size  = Pitch * GMM_ULT_ALIGN(gmmParams.BaseHeight / CompBlock[1], TileSize[1]);
    Size           = GMM_ULT_ALIGN(Size, PAGE_SIZE);

    VerifyResourcePitch<true>(ResourceInfo, Pitch);
    VerifyResourcePitchInTiles<false>(ResourceInfo, Pitch / TileSize[0]);
    VerifyResourceSize<true>(ResourceInfo, Size);
    VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

    pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
}